

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall
ExprTest_EqualLogicalCountExpr_Test::~ExprTest_EqualLogicalCountExpr_Test
          (ExprTest_EqualLogicalCountExpr_Test *this)

{
  void *in_RDI;
  
  ~ExprTest_EqualLogicalCountExpr_Test((ExprTest_EqualLogicalCountExpr_Test *)0x14b128);
  operator_delete(in_RDI,0x58);
  return;
}

Assistant:

TEST_F(ExprTest, EqualLogicalCountExpr) {
  auto n0 = MakeConst(0), n1 = MakeConst(1);
  LogicalExpr args[] = {l0};
  auto count = MakeCount(args);
  EXPECT_TRUE(Equal(factory_.MakeLogicalCount(expr::ATMOST, n0, count),
                    factory_.MakeLogicalCount(expr::ATMOST, n0, count)));
  EXPECT_FALSE(Equal(factory_.MakeLogicalCount(expr::ATMOST, n0, count),
                     factory_.MakeLogicalCount(expr::ATMOST, n1, count)));
}